

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O3

int __thiscall cmVSLink::LinkIncremental(cmVSLink *this)

{
  string *in_relative;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rcCommand;
  string absManifestFile;
  ofstream fout;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_250;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  in_relative = &this->ManifestFile;
  cmsys::SystemTools::CollapseFullPath(&local_250,in_relative);
  if (this->Verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Create ",7);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->ManifestFileRC)._M_dataplus._M_p,
                        (this->ManifestFileRC)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  }
  std::ofstream::ofstream(local_230,(this->ManifestFileRC)._M_dataplus._M_p,_S_out);
  if ((abStack_210[(long)*(_func_int **)(local_230._0_8_ + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"#pragma code_page(65001)\n",0x19);
    poVar7 = (ostream *)std::ostream::operator<<(local_230,this->Type);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," /* CREATEPROCESS_MANIFEST_RESOURCE_ID */ 24 /* RT_MANIFEST */ \"",0x40);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
    uVar4 = _vtable;
    paVar3 = _VTT;
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + (&_VTT->_M_allocated_capacity)[-3]) = _vtable;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
    bVar5 = cmsys::SystemTools::FileExists(in_relative);
    if (!bVar5) {
      if (this->Verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Create empty: ",0xe);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(this->ManifestFile)._M_dataplus._M_p,
                            (this->ManifestFile)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      }
      std::ofstream::ofstream(local_230,(in_relative->_M_dataplus)._M_p,_S_out);
      local_230._0_8_ = paVar3;
      *(undefined8 *)(local_230 + (&paVar3->_M_allocated_capacity)[-3]) = uVar4;
      std::filebuf::~filebuf((filebuf *)(local_230 + 8));
      std::ios_base::~ios_base(local_138);
    }
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar1 = (this->RcPath)._M_string_length;
    local_230._0_8_ = &local_220;
    if (sVar1 == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"rc","");
    }
    else {
      pcVar2 = (this->RcPath)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)local_230,pcVar2,pcVar2 + sVar1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
               (char (*) [4])"/fo");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_268,&this->ManifestFileRes);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_268,&this->ManifestFileRC);
    bVar5 = RunCommand("RC Pass 1",&local_268,this->Verbose,FORMAT_DECIMAL,(int *)0x0,
                       (_func_bool_int *)0x0);
    iVar6 = -1;
    if (bVar5) {
      this_00 = &this->LinkCommand;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&this->ManifestFileRes);
      bVar5 = RunCommand("LINK Pass 1",this_00,this->Verbose,FORMAT_DECIMAL,(int *)0x0,
                         (_func_bool_int *)0x0);
      if (bVar5) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_230,"/out:",in_relative);
        iVar6 = RunMT(this,(string *)local_230,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._0_8_ != &local_220) {
          operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
        }
        if ((iVar6 == 0xbb) || (iVar6 == 0x41020001)) {
          bVar5 = RunCommand("RC Pass 2",&local_268,this->Verbose,FORMAT_DECIMAL,(int *)0x0,
                             (_func_bool_int *)0x0);
          iVar6 = -1;
          if (bVar5) {
            bVar5 = RunCommand("FINAL LINK",this_00,this->Verbose,FORMAT_DECIMAL,(int *)0x0,
                               (_func_bool_int *)0x0);
            iVar6 = bVar5 - 1;
          }
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_268);
  }
  else {
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + (&_VTT->_M_allocated_capacity)[-3]) = _vtable;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
    iVar6 = -1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  return iVar6;
}

Assistant:

int cmVSLink::LinkIncremental()
{
  // This follows the steps listed here:
  // http://blogs.msdn.com/zakramer/archive/2006/05/22/603558.aspx

  //    1.  Compiler compiles the application and generates the *.obj files.
  //    2.  An empty manifest file is generated if this is a clean build and if
  //    not the previous one is reused.
  //    3.  The resource compiler (rc.exe) compiles the *.manifest file to a
  //    *.res file.
  //    4.  Linker generates the binary (EXE or DLL) with the /incremental
  //    switch and embeds the dummy manifest file. The linker also generates
  //    the real manifest file based on the binaries that your binary depends
  //    on.
  //    5.  The manifest tool (mt.exe) is then used to generate the final
  //    manifest.

  // If the final manifest is changed, then 6 and 7 are run, if not
  // they are skipped, and it is done.

  //    6.  The resource compiler is invoked one more time.
  //    7.  Finally, the Linker does another incremental link, but since the
  //    only thing that has changed is the *.res file that contains the
  //    manifest it is a short link.

  // Create a resource file referencing the manifest.
  std::string absManifestFile =
    cmSystemTools::CollapseFullPath(this->ManifestFile);
  if (this->Verbose) {
    std::cout << "Create " << this->ManifestFileRC << "\n";
  }
  {
    cmsys::ofstream fout(this->ManifestFileRC.c_str());
    if (!fout) {
      return -1;
    }
    // Insert a pragma statement to specify utf-8 encoding.
    fout << "#pragma code_page(65001)\n";
    fout << this->Type
         << " /* CREATEPROCESS_MANIFEST_RESOURCE_ID */ "
            "24 /* RT_MANIFEST */ \""
         << absManifestFile << "\"";
  }

  // If we have not previously generated a manifest file,
  // generate an empty one so the resource compiler succeeds.
  if (!cmSystemTools::FileExists(this->ManifestFile)) {
    if (this->Verbose) {
      std::cout << "Create empty: " << this->ManifestFile << "\n";
    }
    cmsys::ofstream foutTmp(this->ManifestFile.c_str());
  }

  // Compile the resource file.
  std::vector<std::string> rcCommand;
  rcCommand.push_back(this->RcPath.empty() ? "rc" : this->RcPath);
  rcCommand.emplace_back("/fo");
  rcCommand.push_back(this->ManifestFileRes);
  rcCommand.push_back(this->ManifestFileRC);
  if (!RunCommand("RC Pass 1", rcCommand, this->Verbose, FORMAT_DECIMAL)) {
    return -1;
  }

  // Tell the linker to use our manifest compiled into a resource.
  this->LinkCommand.push_back(this->ManifestFileRes);

  // Run the link command (possibly generates intermediate manifest).
  if (!RunCommand("LINK Pass 1", this->LinkCommand, this->Verbose,
                  FORMAT_DECIMAL)) {
    return -1;
  }

  // Run the manifest tool to create the final manifest.
  int mtRet = this->RunMT("/out:" + this->ManifestFile, true);

  // If mt returns a special value then it updated the manifest file so
  // we need to embed it again.  Otherwise we are done.
  if (!mtRetIsUpdate(mtRet)) {
    return mtRet;
  }

  // Compile the resource file again.
  if (!RunCommand("RC Pass 2", rcCommand, this->Verbose, FORMAT_DECIMAL)) {
    return -1;
  }

  // Link incrementally again to use the updated resource.
  if (!RunCommand("FINAL LINK", this->LinkCommand, this->Verbose,
                  FORMAT_DECIMAL)) {
    return -1;
  }
  return 0;
}